

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

Expression * __thiscall wasm::TranslateToFuzzReader::makeImportTableGet(TranslateToFuzzReader *this)

{
  char *pcVar1;
  size_t sVar2;
  Call *pCVar3;
  initializer_list<wasm::Expression_*> __l;
  Name target;
  Expression *local_50;
  _Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> local_48;
  Type local_30;
  allocator_type local_21;
  
  pcVar1 = (this->tableGetImportName).super_IString.str._M_str;
  if (pcVar1 != (char *)0x0) {
    sVar2 = (this->tableGetImportName).super_IString.str._M_len;
    local_50 = make(this,(Type)0x2);
    __l._M_len = 1;
    __l._M_array = &local_50;
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&local_48,__l,
               &local_21);
    Type::Type(&local_30,(HeapType)0x10,Nullable,Inexact);
    target.super_IString.str._M_str = pcVar1;
    target.super_IString.str._M_len = sVar2;
    pCVar3 = Builder::makeCall(&this->builder,target,
                               (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                               &local_48,local_30,false);
    std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~_Vector_base
              (&local_48);
    return (Expression *)pCVar3;
  }
  __assert_fail("tableGetImportName",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                ,0x4e2,"Expression *wasm::TranslateToFuzzReader::makeImportTableGet()");
}

Assistant:

Expression* TranslateToFuzzReader::makeImportTableGet() {
  assert(tableGetImportName);
  return builder.makeCall(
    tableGetImportName, {make(Type::i32)}, Type(HeapType::func, Nullable));
}